

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O1

void __thiscall
Utf8Decode_LonelyStartCharacters_Test::TestBody(Utf8Decode_LonelyStartCharacters_Test *this)

{
  allocator_type *paVar1;
  uint8_t v;
  uchar uVar2;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  uchar local_ab [2];
  allocator_type local_a9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  cpstring local_90;
  cpstring local_70;
  cpstring local_50;
  
  uVar2 = 0xc0;
  do {
    local_ab[1] = 0x20;
    __l._M_len = 2;
    __l._M_array = local_ab;
    paVar1 = &local_a9;
    local_ab[0] = uVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_a8,__l,&local_a9);
    (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
              (&local_50,&local_a8,(bytes *)0x0,SUB81(paVar1,0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 4 + 4);
    }
    if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    uVar2 = uVar2 + '\x01';
  } while (uVar2 != 0xe0);
  uVar2 = 0xe0;
  do {
    local_ab[1] = 0x20;
    __l_00._M_len = 2;
    __l_00._M_array = local_ab;
    paVar1 = &local_a9;
    local_ab[0] = uVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_a8,__l_00,&local_a9);
    (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
              (&local_70,&local_a8,(bytes *)0x0,SUB81(paVar1,0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    }
    if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    uVar2 = uVar2 + '\x01';
  } while (uVar2 != 0xf0);
  uVar2 = 0xf0;
  do {
    local_ab[1] = 0x20;
    __l_01._M_len = 2;
    __l_01._M_array = local_ab;
    paVar1 = &local_a9;
    local_ab[0] = uVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_a8,__l_01,&local_a9);
    (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
              (&local_90,&local_a8,(bytes *)0x0,SUB81(paVar1,0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity * 4 + 4);
    }
    if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    uVar2 = uVar2 + '\x01';
  } while (uVar2 != 0xf8);
  return;
}

Assistant:

TEST_F (Utf8Decode, LonelyStartCharacters) {
    // All 32 first bytes of 2-byte sequences (0xC0-0xDF), each followed by a space character.
    for (std::uint8_t v = 0xC0; v <= 0xDF; ++v) {
        decode_bad (bytes ({v, 0x20}));
    }
    // All 16 first bytes of 3-byte sequences (0xE0-0xEF), each followed by a space character.
    for (std::uint8_t v = 0xE0; v <= 0xEF; ++v) {
        decode_bad (bytes ({v, 0x20}));
    }
    // All 8 first bytes of 4-byte sequences (0xF0-0xF7), each followed by a space character.
    for (std::uint8_t v = 0xF0; v <= 0xF7; ++v) {
        decode_bad (bytes ({v, 0x20}));
    }
}